

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O0

double __thiscall
lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>::
optimize(MaskedHungarianBranching<lineage::heuristics::PartitionGraph> *this)

{
  long lVar1;
  long lVar2;
  long *in_RDI;
  double dVar3;
  double objective;
  future<double> second_handle;
  future<double> first_handle;
  long centerFrame;
  undefined1 in_stack_0000032f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000330;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000338;
  HungarianBranching<lineage::heuristics::PartitionGraph> *in_stack_00000340;
  size_t in_stack_ffffffffffffff28;
  HungarianBranching<lineage::heuristics::PartitionGraph> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa0;
  MaskedHungarianBranching<lineage::heuristics::PartitionGraph> **in_stack_ffffffffffffffa8;
  offset_in_HungarianBranching<lineage::heuristics::PartitionGraph>_to_subr
  *in_stack_ffffffffffffffb0;
  launch in_stack_ffffffffffffffbc;
  bool *__args_3;
  double local_8;
  
  (**(code **)(*in_RDI + 8))();
  lVar1 = HungarianBranching<lineage::heuristics::PartitionGraph>::getFrame
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (lVar1 == 0) {
    local_8 = HungarianBranching<lineage::heuristics::PartitionGraph>::optimizeStep
                        (in_stack_00000340,in_stack_00000338,in_stack_00000330,
                         (bool)in_stack_0000032f);
  }
  else {
    lVar2 = HungarianBranching<lineage::heuristics::PartitionGraph>::getMaxFrame
                      ((HungarianBranching<lineage::heuristics::PartitionGraph> *)0x1d3765);
    if (lVar1 == lVar2 + -1) {
      local_8 = HungarianBranching<lineage::heuristics::PartitionGraph>::optimizeStep
                          (in_stack_00000340,in_stack_00000338,in_stack_00000330,
                           (bool)in_stack_0000032f);
    }
    else {
      __args_3 = (bool *)0x0;
      in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
      uVar4 = 1;
      std::
      async<double(lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::*)(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,bool),lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>*,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,bool>
                (in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(bool *)0x0);
      std::
      async<double(lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::*)(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,bool),lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>*,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,bool>
                (in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 HungarianBranching<lineage::heuristics::PartitionGraph>::optimizeStep,__args_3);
      local_8 = std::future<double>::get
                          ((future<double> *)CONCAT44(uVar4,in_stack_ffffffffffffff50));
      dVar3 = std::future<double>::get((future<double> *)CONCAT44(uVar4,in_stack_ffffffffffffff50));
      local_8 = local_8 + dVar3;
      std::future<double>::~future((future<double> *)0x1d38c9);
      std::future<double>::~future((future<double> *)0x1d38d6);
    }
  }
  return local_8;
}

Assistant:

inline double
MaskedHungarianBranching<GRAPH>::optimize()
{
    setup();

    const auto centerFrame = this->getFrame(A_);

    // border cases where only one step has to be solved.
    // We handle these separately to avoid unnecessary overhead
    // from std::async.
    if (centerFrame == 0)
        return this->optimizeStep(second_, third_, false);
    if (centerFrame == this->getMaxFrame() - 1)
        return this->optimizeStep(first_, second_, false);

    // solve subproblem in {t-1,t} and {t,t+1} in parallel.
    auto first_handle = std::async(
        std::launch::async, &MaskedHungarianBranching<GRAPH>::optimizeStep,
        this, first_, second_, false);

    auto second_handle = std::async(
        std::launch::async, &MaskedHungarianBranching<GRAPH>::optimizeStep,
        this, second_, third_, false);

    const auto objective = first_handle.get() + second_handle.get();

    return objective;
}